

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedEnum::GenerateByteSize
          (RepeatedEnum *this,Printer *p)

{
  char cVar1;
  allocator<char> local_121;
  char *local_120;
  size_type local_118;
  char local_110 [8];
  undefined8 uStack_108;
  Printer *p_local;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  undefined1 local_d8 [64];
  __index_type local_98;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  bool local_70;
  bool local_28;
  
  p_local = p;
  if (this->has_cached_size_ != true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"tag_size",&local_121);
    local_d8._0_8_ = local_d8 + 0x10;
    if (local_120 == local_110) {
      local_d8._24_8_ = uStack_108;
    }
    else {
      local_d8._0_8_ = local_120;
    }
    local_d8._8_8_ = local_118;
    local_118 = 0;
    local_110[0] = '\0';
    local_e8 = (code *)0x0;
    pcStack_e0 = (code *)0x0;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_120 = local_110;
    local_f8._M_unused._M_object = operator_new(0x18);
    *(RepeatedEnum **)local_f8._M_unused._0_8_ = this;
    *(Printer ***)((long)local_f8._M_unused._0_8_ + 8) = &p_local;
    *(code *)((long)local_f8._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_e0 = std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_d8 + 0x20),
               (function<bool_()> *)&local_f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70 = false;
    if (local_98 == '\x01') {
      std::__cxx11::string::assign((char *)&local_90);
    }
    local_28 = false;
    google::protobuf::io::Printer::Emit
              (p,local_d8,1,0xc6,
               "\n        std::size_t data_size =\n            ::_pbi::WireFormatLite::EnumSize(this_._internal_$name$());\n        std::size_t tag_size = $tag_size$;\n        total_size += data_size + tag_size;\n      "
              );
    io::Printer::Sub::~Sub((Sub *)local_d8);
    std::__cxx11::string::~string((string *)&local_120);
    return;
  }
  cVar1 = google::protobuf::FieldDescriptor::is_packed();
  if (cVar1 != '\0') {
    io::Printer::Emit(p,0x94,
                      "\n      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(\n          this_._internal_$name$(), $kTagBytes$, this_.$cached_size_$);\n    "
                     );
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/field_generators/enum_field.cc"
             ,0x20a,0x13,"field_->is_packed()");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_d8);
}

Assistant:

void RepeatedEnum::GenerateByteSize(io::Printer* p) const {
  if (has_cached_size_) {
    ABSL_CHECK(field_->is_packed());
    p->Emit(R"cc(
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_$name$(), $kTagBytes$, this_.$cached_size_$);
    )cc");
    return;
  }
  p->Emit(
      {
          {"tag_size",
           [&] {
             if (field_->is_packed()) {
               p->Emit(R"cc(
                 data_size == 0
                     ? 0
                     : $kTagBytes$ + ::_pbi::WireFormatLite::Int32Size(
                                         static_cast<int32_t>(data_size));
               )cc");
             } else {
               p->Emit(R"cc(
                 std::size_t{$kTagBytes$} *
                     ::_pbi::FromIntSize(this_._internal_$name$_size());
               )cc");
             }
           }},
      },
      R"cc(
        std::size_t data_size =
            ::_pbi::WireFormatLite::EnumSize(this_._internal_$name$());
        std::size_t tag_size = $tag_size$;
        total_size += data_size + tag_size;
      )cc");
}